

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

Quaternion * AML::operator+(Quaternion *__return_storage_ptr__,Quaternion *lhs,double s)

{
  Quaternion *pQVar1;
  anon_union_32_2_4720223f_for_Quaternion_0 local_38;
  double local_18;
  double s_local;
  Quaternion *lhs_local;
  
  local_38.data[0] = (lhs->field_0).data[0];
  local_38.data[1] = (lhs->field_0).data[1];
  local_38.data[2] = (lhs->field_0).data[2];
  local_38.data[3] = (lhs->field_0).data[3];
  local_18 = s;
  s_local = (double)lhs;
  pQVar1 = Quaternion::operator+=((Quaternion *)&local_38.field_1,s);
  (__return_storage_ptr__->field_0).data[0] = (pQVar1->field_0).data[0];
  (__return_storage_ptr__->field_0).data[1] = (pQVar1->field_0).data[1];
  (__return_storage_ptr__->field_0).data[2] = (pQVar1->field_0).data[2];
  (__return_storage_ptr__->field_0).data[3] = (pQVar1->field_0).data[3];
  return __return_storage_ptr__;
}

Assistant:

Quaternion operator+(const Quaternion& lhs, double s) { return (Quaternion(lhs) += s); }